

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::setFilterMode
          (GLTextureBuffer *this,FilterMode newMode)

{
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  GLTextureBuffer *in_RDI;
  
  bind(in_RDI,in_ESI,in_RDX,in_ECX);
  checkGLError(true);
  return;
}

Assistant:

void GLTextureBuffer::setFilterMode(FilterMode newMode) {

  bind();

  if (dim == 1) {
    switch (newMode) {
    case FilterMode::Nearest:
      break;
    case FilterMode::Linear:
      break;
    }
  }
  if (dim == 2) {

    switch (newMode) {
    case FilterMode::Nearest:
      break;
    case FilterMode::Linear:
      break;
    }
  }
  checkGLError();
}